

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

int __thiscall
MathML::AST::ConstantExpression::clone
          (ConstantExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConstantExpression *this_00;
  ConstantExpression *copy;
  
  this_00 = (ConstantExpression *)operator_new(0x40);
  ConstantExpression(this_00);
  this_00->mType = this->mType;
  this_00->mValue = this->mValue;
  std::__cxx11::string::operator=((string *)&this_00->mStringValue,(string *)&this->mStringValue);
  return (int)this_00;
}

Assistant:

INode* ConstantExpression::clone(CloneFlags cloneFlags) const
        {
            ConstantExpression* copy = new ConstantExpression();
            copy->mType = mType;
            copy->mValue = mValue;
            copy->mStringValue = mStringValue;
            return copy;
        }